

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O3

v4sf * rfftf1_ps(int n,v4sf *input_readonly,v4sf *work1,v4sf *work2,float *wa,int *ifac)

{
  float *pfVar1;
  float *pfVar2;
  uint uVar3;
  v4sf *pafVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  v4sf *pafVar13;
  v4sf *pafVar14;
  long lVar15;
  v4sf *pafVar16;
  v4sf *pafVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  v4sf *pafVar21;
  long lVar22;
  v4sf *pafVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  v4sf *pafVar27;
  v4sf *ch;
  uint l1;
  ulong uVar28;
  v4sf *pafVar29;
  v4sf *pafVar30;
  int iVar31;
  int iVar32;
  bool bVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  ulong local_120;
  v4sf *local_e8;
  v4sf *local_e0;
  
  uVar7 = (ulong)(uint)n;
  ch = work2;
  if (input_readonly == work2) {
    ch = work1;
  }
  if ((work1 != work2) && (ch != input_readonly)) {
    uVar3 = ifac[1];
    if (0 < (int)uVar3) {
      uVar24 = 1;
      iVar10 = n + -1;
      do {
        iVar32 = ifac[(uVar3 - uVar24) + 2];
        iVar19 = (int)uVar7;
        uVar28 = (long)iVar19 / (long)iVar32;
        uVar7 = uVar28 & 0xffffffff;
        iVar19 = n / iVar19;
        if (3 < iVar32 - 2U) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jcj83429[P]ShapingClipper/pffft.c"
                        ,0x3e2,
                        "v4sf *rfftf1_ps(int, const v4sf *, v4sf *, v4sf *, const float *, const int *)"
                       );
        }
        iVar31 = (iVar32 + -1) * iVar19;
        iVar11 = iVar10 - iVar31;
        l1 = (uint)uVar28;
        switch(iVar32) {
        case 2:
          radf2_ps(iVar19,l1,input_readonly,ch,wa + iVar11);
          break;
        case 3:
          if (0 < (int)l1) {
            lVar8 = (long)iVar19;
            pafVar17 = ch;
            pafVar13 = input_readonly;
            uVar28 = uVar7;
            do {
              pfVar1 = (float *)((long)*pafVar13 + lVar8 * 0x10 * uVar7);
              fVar61 = *pfVar1;
              fVar64 = pfVar1[1];
              fVar67 = pfVar1[2];
              fVar63 = pfVar1[3];
              pfVar1 = (float *)((long)*pafVar13 + lVar8 * 0x10 * (ulong)(l1 * 2));
              fVar34 = *pfVar1;
              fVar35 = pfVar1[1];
              fVar36 = pfVar1[2];
              fVar37 = pfVar1[3];
              fVar42 = fVar61 + fVar34;
              fVar43 = fVar64 + fVar35;
              fVar44 = fVar67 + fVar36;
              fVar45 = fVar63 + fVar37;
              fVar38 = (*pafVar13)[0];
              fVar39 = (*pafVar13)[1];
              fVar40 = (*pafVar13)[2];
              fVar41 = (*pafVar13)[3];
              (*pafVar17)[0] = fVar38 + fVar42;
              (*pafVar17)[1] = fVar39 + fVar43;
              (*pafVar17)[2] = fVar40 + fVar44;
              (*pafVar17)[3] = fVar41 + fVar45;
              pafVar21 = pafVar17 + lVar8 * 2;
              (*pafVar21)[0] = (fVar34 - fVar61) * 0.8660254;
              (*pafVar21)[1] = (fVar35 - fVar64) * 0.8660254;
              (*pafVar21)[2] = (fVar36 - fVar67) * 0.8660254;
              (*pafVar21)[3] = (fVar37 - fVar63) * 0.8660254;
              pafVar21 = pafVar17 + lVar8 * 2 + -1;
              (*pafVar21)[0] = fVar42 * -0.5 + fVar38;
              (*pafVar21)[1] = fVar43 * -0.5 + fVar39;
              (*pafVar21)[2] = fVar44 * -0.5 + fVar40;
              (*pafVar21)[3] = fVar45 * -0.5 + fVar41;
              pafVar17 = pafVar17 + lVar8 * 3;
              pafVar13 = pafVar13 + lVar8;
              uVar28 = uVar28 - 1;
            } while (uVar28 != 0);
            if (iVar19 != 1) {
              local_120 = 0;
              do {
                if (2 < iVar19) {
                  lVar12 = (local_120 + uVar7) * lVar8;
                  lVar15 = (local_120 + l1 * 2) * lVar8;
                  lVar22 = local_120 * 3 * lVar8;
                  lVar25 = (local_120 * 3 + 2) * lVar8;
                  lVar18 = (local_120 * 3 + 1) * lVar8;
                  lVar9 = 2;
                  do {
                    fVar61 = wa[(long)iVar11 + lVar9 + -2];
                    fVar64 = wa[(long)iVar11 + lVar9 + -1];
                    lVar26 = lVar9 + -1;
                    pafVar17 = input_readonly + lVar12 + lVar26;
                    pafVar13 = input_readonly + lVar12 + lVar9;
                    fVar67 = wa[(long)(iVar11 + iVar19) + lVar9 + -2];
                    fVar63 = wa[(long)(iVar11 + iVar19) + lVar9 + -1];
                    fVar38 = fVar64 * (*pafVar13)[0] + (*pafVar17)[0] * fVar61;
                    fVar39 = fVar64 * (*pafVar13)[1] + (*pafVar17)[1] * fVar61;
                    fVar40 = fVar64 * (*pafVar13)[2] + (*pafVar17)[2] * fVar61;
                    fVar41 = fVar64 * (*pafVar13)[3] + (*pafVar17)[3] * fVar61;
                    pafVar21 = input_readonly + lVar15 + lVar26;
                    pafVar16 = input_readonly + lVar15 + lVar9;
                    fVar42 = fVar61 * (*pafVar13)[0] - (*pafVar17)[0] * fVar64;
                    fVar43 = fVar61 * (*pafVar13)[1] - (*pafVar17)[1] * fVar64;
                    fVar44 = fVar61 * (*pafVar13)[2] - (*pafVar17)[2] * fVar64;
                    fVar45 = fVar61 * (*pafVar13)[3] - (*pafVar17)[3] * fVar64;
                    fVar46 = fVar63 * (*pafVar16)[0] + (*pafVar21)[0] * fVar67;
                    fVar48 = fVar63 * (*pafVar16)[1] + (*pafVar21)[1] * fVar67;
                    fVar50 = fVar63 * (*pafVar16)[2] + (*pafVar21)[2] * fVar67;
                    fVar52 = fVar63 * (*pafVar16)[3] + (*pafVar21)[3] * fVar67;
                    fVar54 = fVar67 * (*pafVar16)[0] - (*pafVar21)[0] * fVar63;
                    fVar55 = fVar67 * (*pafVar16)[1] - (*pafVar21)[1] * fVar63;
                    fVar56 = fVar67 * (*pafVar16)[2] - (*pafVar21)[2] * fVar63;
                    fVar57 = fVar67 * (*pafVar16)[3] - (*pafVar21)[3] * fVar63;
                    fVar58 = fVar38 + fVar46;
                    fVar59 = fVar39 + fVar48;
                    fVar60 = fVar40 + fVar50;
                    fVar62 = fVar41 + fVar52;
                    pafVar17 = input_readonly + local_120 * lVar8 + lVar26;
                    fVar61 = (*pafVar17)[0];
                    fVar64 = (*pafVar17)[1];
                    fVar67 = (*pafVar17)[2];
                    fVar63 = (*pafVar17)[3];
                    fVar47 = fVar42 + fVar54;
                    fVar49 = fVar43 + fVar55;
                    fVar51 = fVar44 + fVar56;
                    fVar53 = fVar45 + fVar57;
                    pafVar17 = ch + lVar22 + lVar26;
                    (*pafVar17)[0] = fVar61 + fVar58;
                    (*pafVar17)[1] = fVar64 + fVar59;
                    (*pafVar17)[2] = fVar67 + fVar60;
                    (*pafVar17)[3] = fVar63 + fVar62;
                    pafVar17 = input_readonly + local_120 * lVar8 + lVar9;
                    fVar34 = (*pafVar17)[0];
                    fVar35 = (*pafVar17)[1];
                    fVar36 = (*pafVar17)[2];
                    fVar37 = (*pafVar17)[3];
                    fVar61 = fVar61 - fVar58 * 0.5;
                    fVar64 = fVar64 - fVar59 * 0.5;
                    fVar67 = fVar67 - fVar60 * 0.5;
                    fVar63 = fVar63 - fVar62 * 0.5;
                    fVar42 = (fVar42 - fVar54) * 0.8660254;
                    fVar43 = (fVar43 - fVar55) * 0.8660254;
                    fVar44 = (fVar44 - fVar56) * 0.8660254;
                    fVar45 = (fVar45 - fVar57) * 0.8660254;
                    pafVar17 = ch + lVar22 + lVar9;
                    (*pafVar17)[0] = fVar34 + fVar47;
                    (*pafVar17)[1] = fVar35 + fVar49;
                    (*pafVar17)[2] = fVar36 + fVar51;
                    (*pafVar17)[3] = fVar37 + fVar53;
                    pafVar17 = ch + lVar25 + lVar26;
                    (*pafVar17)[0] = fVar42 + fVar61;
                    (*pafVar17)[1] = fVar43 + fVar64;
                    (*pafVar17)[2] = fVar44 + fVar67;
                    (*pafVar17)[3] = fVar45 + fVar63;
                    pfVar1 = (float *)((long)*ch +
                                      ((long)(((ulong)(uint)((int)lVar18 + (int)(lVar8 - lVar9)) <<
                                              0x20) + -0x100000000) >> 0x1c));
                    *pfVar1 = fVar61 - fVar42;
                    pfVar1[1] = fVar64 - fVar43;
                    pfVar1[2] = fVar67 - fVar44;
                    pfVar1[3] = fVar63 - fVar45;
                    fVar61 = (fVar46 - fVar38) * 0.8660254;
                    fVar64 = (fVar48 - fVar39) * 0.8660254;
                    fVar67 = (fVar50 - fVar40) * 0.8660254;
                    fVar63 = (fVar52 - fVar41) * 0.8660254;
                    fVar34 = fVar34 - fVar47 * 0.5;
                    fVar35 = fVar35 - fVar49 * 0.5;
                    fVar36 = fVar36 - fVar51 * 0.5;
                    fVar37 = fVar37 - fVar53 * 0.5;
                    pafVar17 = ch + lVar25 + lVar9;
                    (*pafVar17)[0] = fVar61 + fVar34;
                    (*pafVar17)[1] = fVar64 + fVar35;
                    (*pafVar17)[2] = fVar67 + fVar36;
                    (*pafVar17)[3] = fVar63 + fVar37;
                    pafVar17 = ch + lVar18 + (lVar8 - lVar9);
                    (*pafVar17)[0] = fVar61 - fVar34;
                    (*pafVar17)[1] = fVar64 - fVar35;
                    (*pafVar17)[2] = fVar67 - fVar36;
                    (*pafVar17)[3] = fVar63 - fVar37;
                    lVar9 = lVar9 + 2;
                  } while (lVar9 < lVar8);
                }
                local_120 = local_120 + 1;
              } while (local_120 != uVar7);
            }
          }
          break;
        case 4:
          radf4_ps(iVar19,l1,input_readonly,ch,wa + iVar11,wa + (iVar11 + iVar19),
                   wa + (iVar19 + iVar11 + iVar19));
          break;
        case 5:
          if (0 < (int)l1) {
            iVar5 = iVar11 + iVar19 + iVar19;
            uVar6 = ~(iVar19 * 6);
            lVar25 = (long)(int)(~l1 * iVar19 + -1);
            lVar18 = (long)iVar19;
            iVar32 = iVar19 * 10;
            lVar12 = (long)(iVar19 * -6 + -2);
            lVar26 = (uVar7 + 1) * lVar18;
            lVar22 = ((ulong)(l1 * 3) + 1) * lVar18;
            lVar8 = ((ulong)(l1 * 4) + 1) * lVar18;
            lVar15 = ((ulong)(l1 * 2) + 1) * lVar18;
            lVar9 = ((ulong)(l1 * 5) + 1) * lVar18;
            iVar20 = iVar19 * 8;
            pafVar4 = ch + lVar12 + lVar18 * 6 + 2;
            pafVar17 = input_readonly + lVar26 + 1;
            pafVar13 = input_readonly + lVar22 + 1;
            pafVar21 = input_readonly + lVar8 + 1;
            pafVar16 = input_readonly + lVar15 + 1;
            pafVar27 = input_readonly + lVar9 + 1;
            uVar28 = uVar7;
            do {
              pafVar29 = pafVar27 + lVar25;
              pafVar30 = pafVar16 + lVar25;
              fVar42 = (*pafVar29)[0] + (*pafVar30)[0];
              fVar43 = (*pafVar29)[1] + (*pafVar30)[1];
              fVar44 = (*pafVar29)[2] + (*pafVar30)[2];
              fVar45 = (*pafVar29)[3] + (*pafVar30)[3];
              fVar34 = (*pafVar29)[0] - (*pafVar30)[0];
              fVar35 = (*pafVar29)[1] - (*pafVar30)[1];
              fVar36 = (*pafVar29)[2] - (*pafVar30)[2];
              fVar37 = (*pafVar29)[3] - (*pafVar30)[3];
              pafVar29 = pafVar21 + lVar25;
              pafVar30 = pafVar13 + lVar25;
              fVar46 = (*pafVar29)[0] + (*pafVar30)[0];
              fVar48 = (*pafVar29)[1] + (*pafVar30)[1];
              fVar50 = (*pafVar29)[2] + (*pafVar30)[2];
              fVar52 = (*pafVar29)[3] + (*pafVar30)[3];
              fVar38 = (*pafVar29)[0] - (*pafVar30)[0];
              fVar39 = (*pafVar29)[1] - (*pafVar30)[1];
              fVar40 = (*pafVar29)[2] - (*pafVar30)[2];
              fVar41 = (*pafVar29)[3] - (*pafVar30)[3];
              pafVar29 = pafVar17 + lVar25;
              fVar61 = (*pafVar29)[0];
              fVar64 = (*pafVar29)[1];
              fVar67 = (*pafVar29)[2];
              fVar63 = (*pafVar29)[3];
              (*pafVar4)[0] = fVar42 + fVar46 + fVar61;
              (*pafVar4)[1] = fVar43 + fVar48 + fVar64;
              (*pafVar4)[2] = fVar44 + fVar50 + fVar67;
              (*pafVar4)[3] = fVar45 + fVar52 + fVar63;
              pafVar29 = ch + (long)(int)uVar6 + (long)iVar20;
              (*pafVar29)[0] = (fVar42 * 0.309017 - fVar46 * 0.809017) + fVar61;
              (*pafVar29)[1] = (fVar43 * 0.309017 - fVar48 * 0.809017) + fVar64;
              (*pafVar29)[2] = (fVar44 * 0.309017 - fVar50 * 0.809017) + fVar67;
              (*pafVar29)[3] = (fVar45 * 0.309017 - fVar52 * 0.809017) + fVar63;
              pafVar29 = ch + (long)(int)uVar6 + (long)iVar20 + 1;
              (*pafVar29)[0] = fVar38 * 0.58778524 + fVar34 * 0.95105654;
              (*pafVar29)[1] = fVar39 * 0.58778524 + fVar35 * 0.95105654;
              (*pafVar29)[2] = fVar40 * 0.58778524 + fVar36 * 0.95105654;
              (*pafVar29)[3] = fVar41 * 0.58778524 + fVar37 * 0.95105654;
              pafVar29 = ch + (long)(int)uVar6 + (long)iVar32;
              (*pafVar29)[0] = (fVar46 * 0.309017 - fVar42 * 0.809017) + fVar61;
              (*pafVar29)[1] = (fVar48 * 0.309017 - fVar43 * 0.809017) + fVar64;
              (*pafVar29)[2] = (fVar50 * 0.309017 - fVar44 * 0.809017) + fVar67;
              (*pafVar29)[3] = (fVar52 * 0.309017 - fVar45 * 0.809017) + fVar63;
              pafVar29 = ch + (long)(int)uVar6 + (long)iVar32 + 1;
              (*pafVar29)[0] = fVar34 * 0.58778524 - fVar38 * 0.95105654;
              (*pafVar29)[1] = fVar35 * 0.58778524 - fVar39 * 0.95105654;
              (*pafVar29)[2] = fVar36 * 0.58778524 - fVar40 * 0.95105654;
              (*pafVar29)[3] = fVar37 * 0.58778524 - fVar41 * 0.95105654;
              iVar32 = iVar32 + iVar19 * 5;
              iVar20 = iVar20 + iVar19 * 5;
              pafVar4 = pafVar4 + lVar18 * 5;
              pafVar17 = pafVar17 + lVar18;
              pafVar13 = pafVar13 + lVar18;
              pafVar21 = pafVar21 + lVar18;
              pafVar16 = pafVar16 + lVar18;
              pafVar27 = pafVar27 + lVar18;
              uVar28 = uVar28 - 1;
            } while (uVar28 != 0);
            if (iVar19 != 1) {
              pafVar29 = input_readonly + lVar25 + lVar26 + 3;
              pafVar17 = input_readonly + lVar25 + lVar9 + 3;
              pafVar13 = input_readonly + lVar25 + lVar8 + 3;
              pafVar27 = input_readonly + lVar25 + lVar22 + 3;
              pafVar30 = input_readonly + lVar25 + lVar15 + 3;
              lVar22 = (long)iVar10 * 4 + (long)iVar31 * -4;
              pafVar21 = ch + lVar12 + lVar18 * 10 + 4;
              pafVar16 = ch + lVar12 + lVar18 * 8 + 4;
              pafVar4 = ch + lVar12 + lVar18 * 6 + 4;
              lVar8 = (long)(iVar5 + iVar19) * 4;
              lVar9 = (long)iVar5 * 4;
              lVar15 = (long)(iVar11 + iVar19) * 4;
              local_e0 = ch + (long)(iVar19 + 2) + lVar12 + lVar18 * 9 + -2;
              local_e8 = ch + (long)(iVar19 + 2) + lVar12 + lVar18 * 7 + -2;
              lVar12 = 1;
              do {
                if (2 < iVar19) {
                  lVar25 = 3;
                  lVar26 = 0;
                  pafVar14 = local_e0;
                  pafVar23 = local_e8;
                  do {
                    fVar61 = *(float *)((long)wa + lVar26 + lVar22);
                    fVar64 = *(float *)((long)wa + lVar26 + lVar22 + 4);
                    fVar67 = *(float *)((long)wa + lVar26 + lVar15);
                    fVar63 = *(float *)((long)wa + lVar26 + lVar15 + 4);
                    fVar34 = *(float *)((long)wa + lVar26 + lVar9);
                    fVar35 = *(float *)((long)wa + lVar26 + lVar9 + 4);
                    fVar36 = *(float *)((long)wa + lVar26 + lVar8);
                    fVar37 = *(float *)((long)wa + lVar26 + lVar8 + 4);
                    pfVar2 = pafVar30[-1] + lVar26;
                    pfVar1 = *pafVar30 + lVar26;
                    fVar54 = *pfVar1 * fVar64 + fVar61 * *pfVar2;
                    fVar55 = pfVar1[1] * fVar64 + fVar61 * pfVar2[1];
                    fVar56 = pfVar1[2] * fVar64 + fVar61 * pfVar2[2];
                    fVar57 = pfVar1[3] * fVar64 + fVar61 * pfVar2[3];
                    fVar58 = fVar64 * *pfVar2 - fVar61 * *pfVar1;
                    fVar59 = fVar64 * pfVar2[1] - fVar61 * pfVar1[1];
                    fVar60 = fVar64 * pfVar2[2] - fVar61 * pfVar1[2];
                    fVar61 = fVar64 * pfVar2[3] - fVar61 * pfVar1[3];
                    pfVar2 = pafVar27[-1] + lVar26;
                    pfVar1 = *pafVar27 + lVar26;
                    fVar68 = *pfVar1 * fVar63 + fVar67 * *pfVar2;
                    fVar69 = pfVar1[1] * fVar63 + fVar67 * pfVar2[1];
                    fVar70 = pfVar1[2] * fVar63 + fVar67 * pfVar2[2];
                    fVar72 = pfVar1[3] * fVar63 + fVar67 * pfVar2[3];
                    fVar64 = fVar63 * *pfVar2 - fVar67 * *pfVar1;
                    fVar65 = fVar63 * pfVar2[1] - fVar67 * pfVar1[1];
                    fVar66 = fVar63 * pfVar2[2] - fVar67 * pfVar1[2];
                    fVar67 = fVar63 * pfVar2[3] - fVar67 * pfVar1[3];
                    pfVar2 = pafVar13[-1] + lVar26;
                    pfVar1 = *pafVar13 + lVar26;
                    fVar47 = *pfVar1 * fVar35 + fVar34 * *pfVar2;
                    fVar49 = pfVar1[1] * fVar35 + fVar34 * pfVar2[1];
                    fVar51 = pfVar1[2] * fVar35 + fVar34 * pfVar2[2];
                    fVar53 = pfVar1[3] * fVar35 + fVar34 * pfVar2[3];
                    fVar38 = fVar35 * *pfVar2 - fVar34 * *pfVar1;
                    fVar39 = fVar35 * pfVar2[1] - fVar34 * pfVar1[1];
                    fVar40 = fVar35 * pfVar2[2] - fVar34 * pfVar1[2];
                    fVar41 = fVar35 * pfVar2[3] - fVar34 * pfVar1[3];
                    pfVar2 = pafVar17[-1] + lVar26;
                    pfVar1 = *pafVar17 + lVar26;
                    fVar42 = *pfVar1 * fVar37 + fVar36 * *pfVar2;
                    fVar43 = pfVar1[1] * fVar37 + fVar36 * pfVar2[1];
                    fVar44 = pfVar1[2] * fVar37 + fVar36 * pfVar2[2];
                    fVar45 = pfVar1[3] * fVar37 + fVar36 * pfVar2[3];
                    fVar46 = fVar37 * *pfVar2 - fVar36 * *pfVar1;
                    fVar48 = fVar37 * pfVar2[1] - fVar36 * pfVar1[1];
                    fVar50 = fVar37 * pfVar2[2] - fVar36 * pfVar1[2];
                    fVar52 = fVar37 * pfVar2[3] - fVar36 * pfVar1[3];
                    fVar78 = fVar54 + fVar42;
                    fVar79 = fVar55 + fVar43;
                    fVar80 = fVar56 + fVar44;
                    fVar81 = fVar57 + fVar45;
                    fVar42 = fVar42 - fVar54;
                    fVar43 = fVar43 - fVar55;
                    fVar44 = fVar44 - fVar56;
                    fVar45 = fVar45 - fVar57;
                    fVar54 = fVar58 - fVar46;
                    fVar55 = fVar59 - fVar48;
                    fVar56 = fVar60 - fVar50;
                    fVar57 = fVar61 - fVar52;
                    fVar46 = fVar46 + fVar58;
                    fVar48 = fVar48 + fVar59;
                    fVar50 = fVar50 + fVar60;
                    fVar52 = fVar52 + fVar61;
                    fVar58 = fVar68 + fVar47;
                    fVar59 = fVar69 + fVar49;
                    fVar60 = fVar70 + fVar51;
                    fVar62 = fVar72 + fVar53;
                    fVar47 = fVar47 - fVar68;
                    fVar49 = fVar49 - fVar69;
                    fVar51 = fVar51 - fVar70;
                    fVar53 = fVar53 - fVar72;
                    fVar68 = fVar64 - fVar38;
                    fVar69 = fVar65 - fVar39;
                    fVar70 = fVar66 - fVar40;
                    fVar72 = fVar67 - fVar41;
                    fVar38 = fVar38 + fVar64;
                    fVar39 = fVar39 + fVar65;
                    fVar40 = fVar40 + fVar66;
                    fVar41 = fVar41 + fVar67;
                    pfVar1 = pafVar29[-1] + lVar26;
                    fVar61 = *pfVar1;
                    fVar64 = pfVar1[1];
                    fVar67 = pfVar1[2];
                    fVar63 = pfVar1[3];
                    pfVar1 = pafVar4[-1] + lVar26;
                    *pfVar1 = fVar58 + fVar78 + fVar61;
                    pfVar1[1] = fVar59 + fVar79 + fVar64;
                    pfVar1[2] = fVar60 + fVar80 + fVar67;
                    pfVar1[3] = fVar62 + fVar81 + fVar63;
                    pfVar1 = *pafVar29 + lVar26;
                    fVar34 = *pfVar1;
                    fVar35 = pfVar1[1];
                    fVar36 = pfVar1[2];
                    fVar37 = pfVar1[3];
                    pfVar1 = *pafVar4 + lVar26;
                    *pfVar1 = fVar34 - (fVar38 + fVar46);
                    pfVar1[1] = fVar35 - (fVar39 + fVar48);
                    pfVar1[2] = fVar36 - (fVar40 + fVar50);
                    pfVar1[3] = fVar37 - (fVar41 + fVar52);
                    fVar74 = fVar34 - (fVar46 * 0.309017 - fVar38 * 0.809017);
                    fVar75 = fVar35 - (fVar48 * 0.309017 - fVar39 * 0.809017);
                    fVar76 = fVar36 - (fVar50 * 0.309017 - fVar40 * 0.809017);
                    fVar77 = fVar37 - (fVar52 * 0.309017 - fVar41 * 0.809017);
                    fVar65 = (fVar78 * 0.309017 - fVar58 * 0.809017) + fVar61;
                    fVar66 = (fVar79 * 0.309017 - fVar59 * 0.809017) + fVar64;
                    fVar71 = (fVar80 * 0.309017 - fVar60 * 0.809017) + fVar67;
                    fVar73 = (fVar81 * 0.309017 - fVar62 * 0.809017) + fVar63;
                    fVar61 = (fVar58 * 0.309017 - fVar78 * 0.809017) + fVar61;
                    fVar64 = (fVar59 * 0.309017 - fVar79 * 0.809017) + fVar64;
                    fVar67 = (fVar60 * 0.309017 - fVar80 * 0.809017) + fVar67;
                    fVar63 = (fVar62 * 0.309017 - fVar81 * 0.809017) + fVar63;
                    fVar34 = fVar34 - (fVar38 * 0.309017 - fVar46 * 0.809017);
                    fVar35 = fVar35 - (fVar39 * 0.309017 - fVar48 * 0.809017);
                    fVar36 = fVar36 - (fVar40 * 0.309017 - fVar50 * 0.809017);
                    fVar37 = fVar37 - (fVar41 * 0.309017 - fVar52 * 0.809017);
                    fVar46 = fVar68 * 0.58778524 + fVar54 * 0.95105654;
                    fVar48 = fVar69 * 0.58778524 + fVar55 * 0.95105654;
                    fVar50 = fVar70 * 0.58778524 + fVar56 * 0.95105654;
                    fVar52 = fVar72 * 0.58778524 + fVar57 * 0.95105654;
                    fVar58 = fVar47 * 0.58778524 + fVar42 * 0.95105654;
                    fVar59 = fVar49 * 0.58778524 + fVar43 * 0.95105654;
                    fVar60 = fVar51 * 0.58778524 + fVar44 * 0.95105654;
                    fVar62 = fVar53 * 0.58778524 + fVar45 * 0.95105654;
                    fVar54 = fVar54 * 0.58778524 - fVar68 * 0.95105654;
                    fVar55 = fVar55 * 0.58778524 - fVar69 * 0.95105654;
                    fVar56 = fVar56 * 0.58778524 - fVar70 * 0.95105654;
                    fVar57 = fVar57 * 0.58778524 - fVar72 * 0.95105654;
                    fVar38 = fVar42 * 0.58778524 - fVar47 * 0.95105654;
                    fVar39 = fVar43 * 0.58778524 - fVar49 * 0.95105654;
                    fVar40 = fVar44 * 0.58778524 - fVar51 * 0.95105654;
                    fVar41 = fVar45 * 0.58778524 - fVar53 * 0.95105654;
                    pfVar1 = pafVar16[-1] + lVar26;
                    *pfVar1 = fVar65 - fVar46;
                    pfVar1[1] = fVar66 - fVar48;
                    pfVar1[2] = fVar71 - fVar50;
                    pfVar1[3] = fVar73 - fVar52;
                    pafVar23[-1][0] = fVar46 + fVar65;
                    pafVar23[-1][1] = fVar48 + fVar66;
                    pafVar23[-1][2] = fVar50 + fVar71;
                    pafVar23[-1][3] = fVar52 + fVar73;
                    pfVar1 = *pafVar16 + lVar26;
                    *pfVar1 = fVar58 + fVar74;
                    pfVar1[1] = fVar59 + fVar75;
                    pfVar1[2] = fVar60 + fVar76;
                    pfVar1[3] = fVar62 + fVar77;
                    (*pafVar23)[0] = fVar58 - fVar74;
                    (*pafVar23)[1] = fVar59 - fVar75;
                    (*pafVar23)[2] = fVar60 - fVar76;
                    (*pafVar23)[3] = fVar62 - fVar77;
                    pfVar1 = pafVar21[-1] + lVar26;
                    *pfVar1 = fVar61 - fVar54;
                    pfVar1[1] = fVar64 - fVar55;
                    pfVar1[2] = fVar67 - fVar56;
                    pfVar1[3] = fVar63 - fVar57;
                    pafVar14[-1][0] = fVar54 + fVar61;
                    pafVar14[-1][1] = fVar55 + fVar64;
                    pafVar14[-1][2] = fVar56 + fVar67;
                    pafVar14[-1][3] = fVar57 + fVar63;
                    pfVar1 = *pafVar21 + lVar26;
                    *pfVar1 = fVar38 + fVar34;
                    pfVar1[1] = fVar39 + fVar35;
                    pfVar1[2] = fVar40 + fVar36;
                    pfVar1[3] = fVar41 + fVar37;
                    (*pafVar14)[0] = fVar38 - fVar34;
                    (*pafVar14)[1] = fVar39 - fVar35;
                    (*pafVar14)[2] = fVar40 - fVar36;
                    (*pafVar14)[3] = fVar41 - fVar37;
                    lVar25 = lVar25 + 2;
                    lVar26 = lVar26 + 8;
                    pafVar14 = pafVar14 + -2;
                    pafVar23 = pafVar23 + -2;
                  } while (lVar25 <= lVar18);
                }
                lVar12 = lVar12 + 1;
                pafVar21 = pafVar21 + lVar18 * 5;
                pafVar16 = pafVar16 + lVar18 * 5;
                pafVar4 = pafVar4 + lVar18 * 5;
                pafVar29 = pafVar29 + lVar18;
                pafVar17 = pafVar17 + lVar18;
                pafVar13 = pafVar13 + lVar18;
                pafVar27 = pafVar27 + lVar18;
                pafVar30 = pafVar30 + lVar18;
                local_e0 = local_e0 + lVar18 * 5;
                local_e8 = local_e8 + lVar18 * 5;
              } while (lVar12 != uVar7 + 1);
            }
          }
        }
        bVar33 = ch == work2;
        input_readonly = work1;
        ch = work2;
        if (bVar33) {
          input_readonly = work2;
          ch = work1;
        }
        uVar24 = uVar24 + 1;
        iVar10 = iVar11;
      } while (uVar24 != uVar3 + 1);
    }
    return input_readonly;
  }
  __assert_fail("in != out && work1 != work2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jcj83429[P]ShapingClipper/pffft.c"
                ,0x3c7,
                "v4sf *rfftf1_ps(int, const v4sf *, v4sf *, v4sf *, const float *, const int *)");
}

Assistant:

static NEVER_INLINE(v4sf *) rfftf1_ps(int n, const v4sf *input_readonly, v4sf *work1, v4sf *work2, 
                                      const float *wa, const int *ifac) {  
  v4sf *in  = (v4sf*)input_readonly;
  v4sf *out = (in == work2 ? work1 : work2);
  int nf = ifac[1], k1;
  int l2 = n;
  int iw = n-1;
  assert(in != out && work1 != work2);
  for (k1 = 1; k1 <= nf; ++k1) {
    int kh = nf - k1;
    int ip = ifac[kh + 2];
    int l1 = l2 / ip;
    int ido = n / l2;
    iw -= (ip - 1)*ido;
    switch (ip) {
      case 5: {
        int ix2 = iw + ido;
        int ix3 = ix2 + ido;
        int ix4 = ix3 + ido;
        radf5_ps(ido, l1, in, out, &wa[iw], &wa[ix2], &wa[ix3], &wa[ix4]);
      } break;
      case 4: {
        int ix2 = iw + ido;
        int ix3 = ix2 + ido;
        radf4_ps(ido, l1, in, out, &wa[iw], &wa[ix2], &wa[ix3]);
      } break;
      case 3: {
        int ix2 = iw + ido;
        radf3_ps(ido, l1, in, out, &wa[iw], &wa[ix2]);
      } break;
      case 2:
        radf2_ps(ido, l1, in, out, &wa[iw]);
        break;
      default:
        assert(0);
        break;
    }
    l2 = l1;
    if (out == work2) {
      out = work1; in = work2;
    } else {
      out = work2; in = work1;
    }
  }
  return in; /* this is in fact the output .. */
}